

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Uint32 anon_unknown.dwarf_115e484::MachineRunner::sdl_callback(Uint32 param_1,void *param)

{
  void *param_local;
  Uint32 param_0_local;
  
  update((MachineRunner *)param);
  return 4;
}

Assistant:

static Uint32 sdl_callback(Uint32, void *param) {
			reinterpret_cast<MachineRunner *>(param)->update();
			return timer_period;
		}